

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
::Inner::Inner(Inner *this,Params *p)

{
  Params *p_local;
  Inner *this_local;
  
  LockableImpl<phmap::NullMutex>::LockableImpl((LockableImpl<phmap::NullMutex> *)this);
  raw_hash_set<phmap::priv::NodeHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::priv::(anonymous_namespace)::Hash,_phmap::priv::(anonymous_namespace)::Eq,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::raw_hash_set(&this->set_,p->bucket_cnt,p->hashfn,p->eq,p->alloc);
  return;
}

Assistant:

Inner(Params const &p) : set_(p.bucket_cnt, p.hashfn, p.eq, p.alloc)
        {}